

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void DC8uvNoLeft_SSE2(uint8_t *dst)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 uVar7;
  undefined1 uVar8;
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(dst + -0x20);
  auVar5 = psadbw((undefined1  [16])0x0,auVar5);
  uVar2 = auVar5._0_4_ + 4;
  uVar3 = uVar2 >> 3;
  bVar1 = (byte)(uVar2 >> 0x18);
  uVar8 = (undefined1)(uVar3 >> 0x10);
  uVar7 = (undefined1)(uVar3 >> 8);
  auVar6._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar1 >> 3,bVar1 >> 3),uVar8),
                                CONCAT14(uVar8,uVar3)) >> 0x20);
  auVar6[3] = uVar7;
  auVar6[2] = uVar7;
  auVar6[0] = (undefined1)uVar3;
  auVar6[1] = auVar6[0];
  auVar6._8_8_ = 0;
  auVar5 = pshuflw(auVar6,auVar6,0);
  lVar4 = 0;
  do {
    *(long *)(dst + lVar4) = auVar5._0_8_;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x100);
  return;
}

Assistant:

static void DC8uvNoLeft_SSE2(uint8_t* dst) {   // DC with no left samples
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadl_epi64((const __m128i*)(dst - BPS));
  const __m128i sum = _mm_sad_epu8(top, zero);
  const int DC = _mm_cvtsi128_si32(sum) + 4;
  Put8x8uv_SSE2(DC >> 3, dst);
}